

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int mark_frames_on_pto(quicly_conn_t *conn,uint8_t ack_epoch,size_t *bytes_to_mark)

{
  int iVar1;
  int iVar2;
  quicly_sent_packet_t *pqVar3;
  size_t sVar4;
  quicly_sentmap_iter_t iter;
  
  iVar1 = init_acks_iter(conn,&iter);
  if (iVar1 == 0) {
    iVar1 = 0;
    do {
      while( true ) {
        pqVar3 = quicly_sentmap_get(&iter);
        if (pqVar3->packet_number == 0xffffffffffffffff) {
          return 0;
        }
        if ((pqVar3->ack_epoch == ack_epoch) && ((pqVar3->field_0x11 & 2) != 0)) break;
        quicly_sentmap_skip(&iter);
      }
      sVar4 = *bytes_to_mark - (ulong)pqVar3->cc_bytes_in_flight;
      if (*bytes_to_mark < (ulong)pqVar3->cc_bytes_in_flight) {
        sVar4 = 0;
      }
      *bytes_to_mark = sVar4;
      iVar2 = quicly_sentmap_update(&(conn->egress).loss.sentmap,&iter,QUICLY_SENTMAP_EVENT_PTO);
      if (iVar2 != 0) {
        return iVar2;
      }
      if ((pqVar3->field_0x11 & 2) != 0) {
        __assert_fail("!sent->frames_in_flight",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0xe1d,"int mark_frames_on_pto(quicly_conn_t *, uint8_t, size_t *)");
      }
    } while (*bytes_to_mark != 0);
  }
  return iVar1;
}

Assistant:

static int mark_frames_on_pto(quicly_conn_t *conn, uint8_t ack_epoch, size_t *bytes_to_mark)
{
    quicly_sentmap_iter_t iter;
    const quicly_sent_packet_t *sent;
    int ret;

    if ((ret = init_acks_iter(conn, &iter)) != 0)
        return ret;

    while ((sent = quicly_sentmap_get(&iter))->packet_number != UINT64_MAX) {
        if (sent->ack_epoch == ack_epoch && sent->frames_in_flight) {
            *bytes_to_mark = *bytes_to_mark > sent->cc_bytes_in_flight ? *bytes_to_mark - sent->cc_bytes_in_flight : 0;
            if ((ret = quicly_sentmap_update(&conn->egress.loss.sentmap, &iter, QUICLY_SENTMAP_EVENT_PTO)) != 0)
                return ret;
            assert(!sent->frames_in_flight);
            if (*bytes_to_mark == 0)
                break;
        } else {
            quicly_sentmap_skip(&iter);
        }
    }

    return 0;
}